

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaBinrIO.cpp
# Opt level: O1

void __thiscall NaBinaryStreamFile::AppendRecord(NaBinaryStreamFile *this)

{
  long *plVar1;
  int iVar2;
  undefined4 *puVar3;
  
  iVar2 = fseek((FILE *)this->fp,0,2);
  if (iVar2 == 0) {
    if (this->iCurLine != -1) {
      fwrite(this->vCurLine,this->nDataSize,(long)this->nVar,(FILE *)this->fp);
    }
    this->iCurLine = this->iCurLine + 1;
    plVar1 = &(this->super_NaDataFile).nRecords;
    *plVar1 = *plVar1 + 1;
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 8;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaBinaryStreamFile::AppendRecord ()
{
  if(0 != fseek(fp, 0, SEEK_END))
    throw(na_write_error);

  if(-1 != iCurLine)
    fwrite(vCurLine, nDataSize, nVar, fp);

  ++iCurLine;
  ++nRecords;
}